

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O2

void __thiscall
TorController::add_onion_cb(TorController *this,TorControlConnection *_conn,TorControlReply *reply)

{
  uint16_t portDefault;
  long lVar1;
  pointer pbVar2;
  DNSLookupFn dns_lookup_function;
  bool bVar3;
  iterator iVar4;
  CChainParams *pCVar5;
  string *s;
  pointer pbVar6;
  char *this_00;
  TorController *this_01;
  path *this_02;
  CService *this_03;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view str;
  undefined8 in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_b0;
  allocator<char> local_89;
  key_type local_88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (reply->code == 0x1fe) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      logging_function_00._M_str = "add_onion_cb";
      logging_function_00._M_len = 0xc;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file_00._M_len = 0x57;
      ::LogPrintf_<>(logging_function_00,source_file_00,0x1c1,ALL,Info,
                     "tor: Add onion failed with unrecognized command (You probably need to upgrade Tor)\n"
                    );
      return;
    }
    goto LAB_00336e9e;
  }
  if (reply->code != 0xfa) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      logging_function_01._M_str = "add_onion_cb";
      logging_function_01._M_len = 0xc;
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file_01._M_len = 0x57;
      LogPrintf_<int>(logging_function_01,source_file_01,0x1c3,ALL,Info,
                      "tor: Add onion failed; error code %d\n",&reply->code);
      return;
    }
    goto LAB_00336e9e;
  }
  bVar3 = ::LogAcceptCategory((LogFlags)this,(Level)_conn);
  if (bVar3) {
    logging_function._M_str = "add_onion_cb";
    logging_function._M_len = 0xc;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file._M_len = 0x57;
    ::LogPrintf_<>(logging_function,source_file,0x1a7,TOR,Debug,"ADD_ONION successful\n");
  }
  pbVar2 = (reply->lines).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __lhs = &this->service_id;
  this_01 = (TorController *)&this->private_key;
  for (pbVar6 = (reply->lines).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1) {
    ParseTorReplyMapping(&m,pbVar6);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"ServiceID",&local_89);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&m,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    if ((_Rb_tree_header *)iVar4._M_node != &m._M_t._M_impl.super__Rb_tree_header) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (iVar4._M_node + 2));
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"PrivateKey",&local_89);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&m,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    if ((_Rb_tree_header *)iVar4._M_node != &m._M_t._M_impl.super__Rb_tree_header) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (iVar4._M_node + 2));
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&m);
  }
  if ((this->service_id)._M_string_length == 0) {
    logging_function_04._M_str = "add_onion_cb";
    logging_function_04._M_len = 0xc;
    source_file_04._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file_04._M_len = 0x57;
    ::LogPrintf_<>(logging_function_04,source_file_04,0x1b1,ALL,Info,
                   "tor: Error parsing ADD_ONION parameters:\n");
    pbVar2 = (reply->lines).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar6 = (reply->lines).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1)
    {
      str._M_str = (pbVar6->_M_dataplus)._M_p;
      str._M_len = pbVar6->_M_string_length;
      SanitizeString_abi_cxx11_((string *)&m,str,0);
      logging_function_05._M_str = "add_onion_cb";
      logging_function_05._M_len = 0xc;
      source_file_05._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file_05._M_len = 0x57;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function_05,source_file_05,0x1b3,ALL,Info,"    %s\n",(string *)&m);
      std::__cxx11::string::~string((string *)&m);
    }
  }
  else {
    std::operator+(&local_88,__lhs,".onion");
    pCVar5 = Params();
    portDefault = pCVar5->nDefaultPort;
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function(&local_b0,&g_dns_lookup_abi_cxx11_);
    dns_lookup_function.super__Function_base._M_functor._8_8_ = __lhs;
    dns_lookup_function.super__Function_base._M_functor._M_unused._M_object =
         (void *)in_stack_ffffffffffffff28;
    dns_lookup_function.super__Function_base._M_manager = (_Manager_type)this_01;
    dns_lookup_function._M_invoker = (_Invoker_type)reply;
    LookupNumeric((CService *)&m,&local_88,portDefault,dns_lookup_function);
    this_03 = &this->service;
    CService::operator=(this_03,(CService *)&m);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&m);
    std::_Function_base::~_Function_base(&local_b0.super__Function_base);
    std::__cxx11::string::~string((string *)&local_88);
    CService::ToStringAddrPort_abi_cxx11_((string *)&m,this_03);
    logging_function_02._M_str = "add_onion_cb";
    logging_function_02._M_len = 0xc;
    this_00 = "add_onion_cb";
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file_02._M_len = 0x57;
    LogPrintf_<std::__cxx11::string,std::__cxx11::string>
              (logging_function_02,source_file_02,0x1b8,ALL,Info,
               "Got tor service ID %s, advertising service %s\n",__lhs,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&m);
    std::__cxx11::string::~string((string *)&m);
    GetPrivateKeyFile((path *)&m,(TorController *)this_00);
    bVar3 = WriteBinaryFile((path *)&m,(string *)this_01);
    this_02 = (path *)&m;
    std::filesystem::__cxx11::path::~path(this_02);
    if (bVar3) {
      bVar3 = ::LogAcceptCategory((LogFlags)this_02,(Level)this_01);
      if (bVar3) {
        GetPrivateKeyFile((path *)&m,this_01);
        std::filesystem::__cxx11::path::string(&local_88,(path *)&m);
        logging_function_03._M_str = "add_onion_cb";
        logging_function_03._M_len = 0xc;
        source_file_03._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
        ;
        source_file_03._M_len = 0x57;
        ::LogPrintf_<std::__cxx11::string>
                  (logging_function_03,source_file_03,0x1ba,TOR,Debug,
                   "Cached service private key to %s\n",&local_88);
        goto LAB_00336d83;
      }
    }
    else {
      GetPrivateKeyFile((path *)&m,this_01);
      std::filesystem::__cxx11::path::string(&local_88,(path *)&m);
      logging_function_06._M_str = "add_onion_cb";
      logging_function_06._M_len = 0xc;
      source_file_06._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file_06._M_len = 0x57;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function_06,source_file_06,0x1bc,ALL,Info,
                 "tor: Error writing service private key to %s\n",&local_88);
LAB_00336d83:
      std::__cxx11::string::~string((string *)&local_88);
      std::filesystem::__cxx11::path::~path((path *)&m);
    }
    AddLocal(this_03,4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00336e9e:
  __stack_chk_fail();
}

Assistant:

void TorController::add_onion_cb(TorControlConnection& _conn, const TorControlReply& reply)
{
    if (reply.code == 250) {
        LogDebug(BCLog::TOR, "ADD_ONION successful\n");
        for (const std::string &s : reply.lines) {
            std::map<std::string,std::string> m = ParseTorReplyMapping(s);
            std::map<std::string,std::string>::iterator i;
            if ((i = m.find("ServiceID")) != m.end())
                service_id = i->second;
            if ((i = m.find("PrivateKey")) != m.end())
                private_key = i->second;
        }
        if (service_id.empty()) {
            LogPrintf("tor: Error parsing ADD_ONION parameters:\n");
            for (const std::string &s : reply.lines) {
                LogPrintf("    %s\n", SanitizeString(s));
            }
            return;
        }
        service = LookupNumeric(std::string(service_id+".onion"), Params().GetDefaultPort());
        LogInfo("Got tor service ID %s, advertising service %s\n", service_id, service.ToStringAddrPort());
        if (WriteBinaryFile(GetPrivateKeyFile(), private_key)) {
            LogDebug(BCLog::TOR, "Cached service private key to %s\n", fs::PathToString(GetPrivateKeyFile()));
        } else {
            LogPrintf("tor: Error writing service private key to %s\n", fs::PathToString(GetPrivateKeyFile()));
        }
        AddLocal(service, LOCAL_MANUAL);
        // ... onion requested - keep connection open
    } else if (reply.code == 510) { // 510 Unrecognized command
        LogPrintf("tor: Add onion failed with unrecognized command (You probably need to upgrade Tor)\n");
    } else {
        LogPrintf("tor: Add onion failed; error code %d\n", reply.code);
    }
}